

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lists.cc
# Opt level: O3

void __thiscall Lists<std::shared_ptr<Array>_>::clear(Lists<std::shared_ptr<Array>_> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  p_Var1 = (this->theHead).
           super___shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->theHead).super___shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->theHead).super___shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->theLast).
           super___shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->theLast).super___shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->theLast).super___shared_ptr<ListNodes<std::shared_ptr<Array>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  this->theSize = 0;
  return;
}

Assistant:

void Lists<T>::clear() {
    theHead = nullptr;
    theLast = nullptr;
    theSize = 0;
}